

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

Builder * __thiscall
arangodb::velocypack::Builder::closeEmptyArrayOrObject(Builder *this,ValueLength pos,bool isArray)

{
  uint8_t uVar1;
  byte in_DL;
  long in_RSI;
  Builder *in_RDI;
  Builder *in_stack_00000030;
  size_t in_stack_ffffffffffffffd8;
  
  uVar1 = '\n';
  if ((in_DL & 1) != 0) {
    uVar1 = '\x01';
  }
  in_RDI->_start[in_RSI] = uVar1;
  rollback(in_RDI,in_stack_ffffffffffffffd8);
  closeLevel(in_stack_00000030);
  return in_RDI;
}

Assistant:

Builder& Builder::closeEmptyArrayOrObject(ValueLength pos, bool isArray) {
  // empty Array or Object
  _start[pos] = (isArray ? 0x01 : 0x0a);
  VELOCYPACK_ASSERT(_pos == pos + 9);
  rollback(8);  // no bytelength and number subvalues needed
  closeLevel();
  return *this;
}